

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O0

int max_ex_tab(expr *expr,fts_symbol_t s,ex_ex *arg,ex_ex *optr)

{
  fts_symbol_t object;
  int iVar1;
  char *pcVar2;
  t_word *local_50;
  t_word *wvec;
  long indx;
  _garray *p_Stack_38;
  int size;
  _garray *garray;
  ex_ex *optr_local;
  ex_ex *arg_local;
  fts_symbol_t s_local;
  expr *expr_local;
  
  garray = (_garray *)optr;
  optr_local = arg;
  arg_local = (ex_ex *)s;
  s_local = (fts_symbol_t)expr;
  if (((s == (fts_symbol_t)0x0) ||
      (p_Stack_38 = (_garray *)pd_findbyclass(s,garray_class), p_Stack_38 == (_garray *)0x0)) ||
     (iVar1 = garray_getfloatwords(p_Stack_38,(int *)((long)&indx + 4),&local_50), iVar1 == 0)) {
    object = s_local;
    (garray->x_gobj).g_next = (_gobj *)0x2;
    *(undefined4 *)&(garray->x_gobj).g_pd = 0;
    pcVar2 = ex_symname((fts_symbol_t)arg_local);
    pd_error(object,"no such table \'%s\'",pcVar2);
    expr_local._4_4_ = 1;
  }
  else {
    (garray->x_gobj).g_next = (_gobj *)0x2;
    if (optr_local->ex_type == 1) {
      wvec = (t_word *)(optr_local->ex_cont).v_vec;
    }
    else if (optr_local->ex_type == 2) {
      wvec = (t_word *)(long)(optr_local->ex_cont).v_flt;
    }
    else {
      pd_error(s_local,"expr: bad argument for table \'%s\'\n",(arg_local->ex_cont).v_int);
      wvec = (t_word *)0x0;
    }
    if ((long)wvec < 0) {
      wvec = (t_word *)0x0;
    }
    else if ((long)indx._4_4_ <= (long)wvec) {
      wvec = (t_word *)(long)(indx._4_4_ + -1);
    }
    *(t_float *)&(garray->x_gobj).g_pd = local_50[(long)wvec].w_float;
    expr_local._4_4_ = 0;
  }
  return expr_local._4_4_;
}

Assistant:

int
max_ex_tab(struct expr *expr, fts_symbol_t s, struct ex_ex *arg,
    struct ex_ex *optr)
{
#ifdef PD
        t_garray *garray;
        int size;
        long indx;
        t_word *wvec;

        if (!s || !(garray = (t_garray *)pd_findbyclass(s, garray_class)) ||
            !garray_getfloatwords(garray, &size, &wvec))
        {
                optr->ex_type = ET_FLT;
                optr->ex_flt = 0;
                pd_error(expr, "no such table '%s'", ex_symname(s));
                return (1);
        }
        optr->ex_type = ET_FLT;

        switch (arg->ex_type) {
        case ET_INT:
                indx = arg->ex_int;
                break;
        case ET_FLT:
                /* strange interpolation code deleted here -msp */
                indx = arg->ex_flt;
                break;

        default:        /* do something with strings */
                pd_error(expr, "expr: bad argument for table '%s'\n", fts_symbol_name(s));
                indx = 0;
        }
        if (indx < 0) indx = 0;
        else if (indx >= size) indx = size - 1;
        optr->ex_flt = wvec[indx].w_float;
#else /* MSP */
        /*
         * table lookup not done for MSP yet
         */
        post("max_ex_tab: not complete for MSP yet!");
        optr->ex_type = ET_FLT;
        optr->ex_flt = 0;
#endif
        return (0);
}